

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O0

int32 __thiscall rw::HAnimHierarchy::getIndex(HAnimHierarchy *this,int32 id)

{
  int local_20;
  int32 i;
  int32 id_local;
  HAnimHierarchy *this_local;
  
  local_20 = 0;
  while( true ) {
    if (this->numNodes <= local_20) {
      return -1;
    }
    if (this->nodeInfo[local_20].id == id) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

int32
HAnimHierarchy::getIndex(int32 id)
{
	for(int32 i = 0; i < this->numNodes; i++)
		if(this->nodeInfo[i].id == id)
			return i;
	return -1;
}